

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

CBlockIndex * LastCommonAncestor(CBlockIndex *pa,CBlockIndex *pb)

{
  int height;
  int height_00;
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  height = pa->nHeight;
  height_00 = pb->nHeight;
  if (height_00 < height) {
    pa = CBlockIndex::GetAncestor(pa,height_00);
  }
  else if (height < height_00) {
    pb = CBlockIndex::GetAncestor(pb,height);
  }
  for (; ((pb != (CBlockIndex *)0x0 && (pa != (CBlockIndex *)0x0)) && (pa != pb)); pa = pa->pprev) {
    pb = pb->pprev;
  }
  if (pa == pb) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return pa;
    }
    __stack_chk_fail();
  }
  __assert_fail("pa == pb",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.cpp"
                ,0xb2,
                "const CBlockIndex *LastCommonAncestor(const CBlockIndex *, const CBlockIndex *)");
}

Assistant:

const CBlockIndex* LastCommonAncestor(const CBlockIndex* pa, const CBlockIndex* pb) {
    if (pa->nHeight > pb->nHeight) {
        pa = pa->GetAncestor(pb->nHeight);
    } else if (pb->nHeight > pa->nHeight) {
        pb = pb->GetAncestor(pa->nHeight);
    }

    while (pa != pb && pa && pb) {
        pa = pa->pprev;
        pb = pb->pprev;
    }

    // Eventually all chain branches meet at the genesis block.
    assert(pa == pb);
    return pa;
}